

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psac.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  ostream *poVar4;
  size_t max_local_size;
  allocator local_6a1;
  MPI_Comm local_6a0;
  timer t;
  string local_str;
  comm local_670;
  double local_650;
  int argc_local;
  rep local_640;
  env e;
  char **argv_local;
  comm comm;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  sa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  SwitchArg checkArg;
  SwitchArg lcpArg;
  ValueArg<int> seedArg;
  ValueArg<unsigned_long> randArg;
  CmdLine cmd;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> fileArg
  ;
  
  argc_local = argc;
  argv_local = argv;
  mxx::env::env(&e,&argc_local,&argv_local);
  mxx::env::set_exception_on_error();
  mxx::comm::comm(&comm);
  std::__cxx11::string::string
            ((string *)&fileArg,"Parallel distirbuted suffix array and LCP construction.",
             (allocator *)&seedArg);
  std::__cxx11::string::string((string *)&randArg,"none",(allocator *)&sa);
  TCLAP::CmdLine::CmdLine(&cmd,(string *)&fileArg,' ',(string *)&randArg,true);
  std::__cxx11::string::~string((string *)&randArg);
  std::__cxx11::string::~string((string *)&fileArg);
  std::__cxx11::string::string((string *)&randArg,"f",(allocator *)&checkArg);
  std::__cxx11::string::string((string *)&seedArg,"file",(allocator *)&local_str);
  std::__cxx11::string::string((string *)&sa,"Input filename.",(allocator *)&local_670);
  std::__cxx11::string::string((string *)&local_530,"",(allocator *)&t);
  std::__cxx11::string::string((string *)&lcpArg,"filename",(allocator *)&local_6a0);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&fileArg,(string *)&randArg,(string *)&seedArg,(string *)&sa,true,&local_530,
             (string *)&lcpArg,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&lcpArg);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&sa);
  std::__cxx11::string::~string((string *)&seedArg);
  std::__cxx11::string::~string((string *)&randArg);
  std::__cxx11::string::string((string *)&seedArg,"r",(allocator *)&local_str);
  std::__cxx11::string::string((string *)&sa,"random",(allocator *)&local_670);
  std::__cxx11::string::string((string *)&lcpArg,"Random input size",(allocator *)&t);
  std::__cxx11::string::string((string *)&checkArg,"size",(allocator *)&local_6a0);
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (&randArg,(string *)&seedArg,(string *)&sa,(string *)&lcpArg,true,0,(string *)&checkArg,
             (Visitor *)0x0);
  std::__cxx11::string::~string((string *)&checkArg);
  std::__cxx11::string::~string((string *)&lcpArg);
  std::__cxx11::string::~string((string *)&sa);
  std::__cxx11::string::~string((string *)&seedArg);
  TCLAP::CmdLine::xorAdd(&cmd,&fileArg.super_Arg,&randArg.super_Arg);
  std::__cxx11::string::string((string *)&sa,"s",(allocator *)&local_670);
  std::__cxx11::string::string((string *)&lcpArg,"seed",(allocator *)&t);
  std::__cxx11::string::string
            ((string *)&checkArg,"Sets the seed for the ranom input generation",
             (allocator *)&local_6a0);
  std::__cxx11::string::string((string *)&local_str,"int",&local_6a1);
  TCLAP::ValueArg<int>::ValueArg
            (&seedArg,(string *)&sa,(string *)&lcpArg,(string *)&checkArg,false,0,&local_str,
             (Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_str);
  std::__cxx11::string::~string((string *)&checkArg);
  std::__cxx11::string::~string((string *)&lcpArg);
  std::__cxx11::string::~string((string *)&sa);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&seedArg);
  std::__cxx11::string::string((string *)&sa,"l",(allocator *)&local_670);
  std::__cxx11::string::string((string *)&checkArg,"lcp",(allocator *)&t);
  std::__cxx11::string::string
            ((string *)&local_str,"Construct the LCP alongside the SA.",(allocator *)&local_6a0);
  TCLAP::SwitchArg::SwitchArg
            (&lcpArg,(string *)&sa,(string *)&checkArg,&local_str,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_str);
  std::__cxx11::string::~string((string *)&checkArg);
  std::__cxx11::string::~string((string *)&sa);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&lcpArg);
  std::__cxx11::string::string((string *)&sa,"c",(allocator *)&t);
  std::__cxx11::string::string((string *)&local_str,"check",(allocator *)&local_6a0);
  std::__cxx11::string::string((string *)&local_670,"Check correctness of SA (and LCP).",&local_6a1)
  ;
  max_local_size = 0;
  TCLAP::SwitchArg::SwitchArg
            (&checkArg,(string *)&sa,&local_str,(string *)&local_670,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_str);
  std::__cxx11::string::~string((string *)&sa);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&checkArg);
  TCLAP::CmdLine::parse(&cmd,argc_local,argv_local);
  local_str._M_dataplus._M_p = (pointer)&local_str.field_2;
  local_str._M_string_length = 0;
  local_str.field_2._M_local_buf[0] = '\0';
  bVar3 = std::operator!=(&fileArg._value,"");
  if (bVar3) {
    mxx::file_block_decompose_abi_cxx11_
              ((string *)&sa,(mxx *)fileArg._value._M_dataplus._M_p,&ompi_mpi_comm_world,
               (MPI_Comm)0x0,max_local_size);
  }
  else {
    rand_dna_abi_cxx11_((string *)&sa,randArg._value / (ulong)(long)comm.m_size,
                        comm.m_rank * seedArg.super_Arg._164_4_);
  }
  std::__cxx11::string::operator=((string *)&local_str,(string *)&sa);
  std::__cxx11::string::~string((string *)&sa);
  t.start.__d.__r = (time_point)(duration)0x0;
  t.start.__d.__r = (time_point)std::chrono::_V2::steady_clock::now();
  local_640 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed(&t);
  sVar2 = local_str._M_string_length;
  _Var1 = local_str._M_dataplus;
  if (lcpArg.super_Arg._163_1_ == '\x01') {
    local_6a0 = (MPI_Comm)&ompi_mpi_comm_world;
    mxx::comm::comm(&local_670,&local_6a0);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
    ::suffix_array(&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )_Var1._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(_Var1._M_p + sVar2),&local_670);
    mxx::comm::~comm(&local_670);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
    ::construct(&sa,true,0);
    local_650 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed(&t)
    ;
    if (comm.m_rank == 0) {
      std::operator<<((ostream *)&std::cerr,"PSAC time: ");
      poVar4 = std::ostream::_M_insert<double>(local_650 - local_640);
      poVar4 = std::operator<<(poVar4," ms");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    sVar2 = local_str._M_string_length;
    _Var1._M_p = local_str._M_dataplus._M_p;
    if (checkArg.super_Arg._163_1_ == '\x01') {
      local_6a0 = (MPI_Comm)&ompi_mpi_comm_world;
      mxx::comm::comm(&local_670,&local_6a0);
      gl_check_correct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                (&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )_Var1._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(_Var1._M_p + sVar2),&local_670);
      mxx::comm::~comm(&local_670);
    }
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
    ::~suffix_array(&sa);
  }
  else {
    local_6a0 = (MPI_Comm)&ompi_mpi_comm_world;
    mxx::comm::comm(&local_670,&local_6a0);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                    *)&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )_Var1._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(_Var1._M_p + sVar2),&local_670);
    mxx::comm::~comm(&local_670);
    suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::
    construct_arr<2ul>((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                        *)&sa,true);
    local_650 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed(&t)
    ;
    if (comm.m_rank == 0) {
      std::operator<<((ostream *)&std::cerr,"PSAC time: ");
      poVar4 = std::ostream::_M_insert<double>(local_650 - local_640);
      poVar4 = std::operator<<(poVar4," ms");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    sVar2 = local_str._M_string_length;
    _Var1._M_p = local_str._M_dataplus._M_p;
    if (checkArg.super_Arg._163_1_ == '\x01') {
      local_6a0 = (MPI_Comm)&ompi_mpi_comm_world;
      mxx::comm::comm(&local_670,&local_6a0);
      gl_check_correct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                  *)&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )_Var1._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(_Var1._M_p + sVar2),&local_670);
      mxx::comm::~comm(&local_670);
    }
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::~suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                     *)&sa);
  }
  std::__cxx11::string::~string((string *)&local_str);
  TCLAP::Arg::~Arg(&checkArg.super_Arg);
  TCLAP::Arg::~Arg(&lcpArg.super_Arg);
  TCLAP::ValueArg<int>::~ValueArg(&seedArg);
  TCLAP::ValueArg<unsigned_long>::~ValueArg(&randArg);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&fileArg);
  TCLAP::CmdLine::~CmdLine(&cmd);
  mxx::comm::~comm(&comm);
  mxx::env::~env(&e);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    // set up MPI
    //MPI_Init(&argc, &argv);
    //int rank, p;
    //MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    //MPI_Comm_size(MPI_COMM_WORLD, &p);
    mxx::env e(argc, argv);
    mxx::env::set_exception_on_error();
    mxx::comm comm = mxx::comm();

    try {
    // define commandline usage
    TCLAP::CmdLine cmd("Parallel distirbuted suffix array and LCP construction.");
    TCLAP::ValueArg<std::string> fileArg("f", "file", "Input filename.", true, "", "filename");
    TCLAP::ValueArg<std::size_t> randArg("r", "random", "Random input size", true, 0, "size");
    cmd.xorAdd(fileArg, randArg);
    TCLAP::ValueArg<int> seedArg("s", "seed", "Sets the seed for the ranom input generation", false, 0, "int");
    cmd.add(seedArg);
    TCLAP::SwitchArg  lcpArg("l", "lcp", "Construct the LCP alongside the SA.", false);
    cmd.add(lcpArg);
    TCLAP::SwitchArg  checkArg("c", "check", "Check correctness of SA (and LCP).", false);
    cmd.add(checkArg);
    cmd.parse(argc, argv);

    // read input file or generate input on master processor
    // block decompose input file
    std::string local_str;
    if (fileArg.getValue() != "") {
        local_str = mxx::file_block_decompose(fileArg.getValue().c_str(), MPI_COMM_WORLD);
    } else {
        // TODO proper distributed random!
        local_str = rand_dna(randArg.getValue()/comm.size(), seedArg.getValue() * comm.rank());
    }

    // TODO differentiate between index types

    // run our distributed suffix array construction
    mxx::timer t;
    double start = t.elapsed();
    if (lcpArg.getValue()) {
        // construct with LCP
        suffix_array<std::string::iterator, index_t, true> sa(local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        // TODO choose construction method
        sa.construct(true);
        double end = t.elapsed() - start;
        if (comm.rank() == 0)
            std::cerr << "PSAC time: " << end << " ms" << std::endl;
        if (checkArg.getValue()) {
            gl_check_correct(sa, local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        }
    } else {
        // construct without LCP
        suffix_array<std::string::iterator, index_t, false> sa(local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        // TODO choose construction method
        sa.construct_arr<2>(true);
        double end = t.elapsed() - start;
        if (comm.rank() == 0)
            std::cerr << "PSAC time: " << end << " ms" << std::endl;
        if (checkArg.getValue()) {
            gl_check_correct(sa, local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        }
    }

    // catch any TCLAP exception
    } catch (TCLAP::ArgException& e) {
        std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
        exit(EXIT_FAILURE);
    }

    // finalize MPI
    //MPI_Finalize();

    return 0;
}